

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomp.c
# Opt level: O2

double dd_ev(long ndims,Integer *ardims,Integer *pedims)

{
  long lVar1;
  long lVar2;
  double dVar3;
  
  lVar2 = 0;
  if (ndims < 1) {
    ndims = lVar2;
  }
  dVar3 = 1.0;
  for (; ndims != lVar2; lVar2 = lVar2 + 1) {
    lVar1 = ardims[lVar2];
    dVar3 = dVar3 * ((double)(lVar1 - lVar1 % pedims[lVar2]) / (double)lVar1);
  }
  return dVar3;
}

Assistant:

double dd_ev(long ndims,Integer ardims[], Integer pedims[])
      {
      double q, t;
      long k;
      q = 1.0;
      t = 1.0;
      for(k=0;k<ndims;k++){
          q = (ardims[k]/pedims[k])*pedims[k];
          t = t*(q/(double)ardims[k]);
      }
      return t;
      }